

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiple.cc
# Opt level: O1

int main(void)

{
  int iVar1;
  ThreadPool t;
  ThreadPool aTStack_d8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  ThreadPool local_c8 [168];
  
  ThreadPool::ThreadPool(local_c8,true);
  iVar1 = 0x14;
  do {
    ThreadPool::submit<void(&)()>(aTStack_d8,(_func_void *)local_c8);
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  WorkItemScheduler::~WorkItemScheduler((WorkItemScheduler *)local_c8);
  return 0;
}

Assistant:

int main(void)
{
    ThreadPool t;

    for (int i = 0; i < 20; ++i)
        t.submit(long_work);

    return 0;
}